

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O2

iterator_range<burst::bitap_iterator<burst::algorithm::bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
burst::bitap<std::bitset<32ul>,std::__cxx11::string,std::__cxx11::string>
          (iterator_range<burst::bitap_iterator<burst::algorithm::bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,burst *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pattern,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *text)

{
  bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_> bitap;
  bitap_iterator<burst::algorithm::bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  bitap_iterator<burst::algorithm::bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  __shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
  local_100;
  __shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
  local_f0;
  bitap_iterator<burst::algorithm::bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  bitap_iterator<burst::algorithm::bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  bitap_iterator<burst::algorithm::bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  bitap_iterator<burst::algorithm::bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  
  algorithm::bitap<char,std::bitset<32ul>,std::array<std::bitset<32ul>,256ul>>::
  bitap<std::__cxx11::string>
            ((bitap<char,std::bitset<32ul>,std::array<std::bitset<32ul>,256ul>> *)&local_f0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::
  __shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_100,&local_f0);
  make_bitap_iterator<char,std::bitset<32ul>,std::array<std::bitset<32ul>,256ul>,std::__cxx11::string>
            (&local_e0,(burst *)&local_100,
             (bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_> *)pattern,text);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
  bitap_iterator<burst::algorithm::bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::bitap_iterator(&local_b0,&local_e0);
  bitap_iterator<burst::algorithm::bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::bitap_iterator(&local_50,&local_e0);
  bitap_iterator<burst::algorithm::bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::bitap_iterator(&local_80,&local_b0);
  boost::
  make_iterator_range<burst::bitap_iterator<burst::algorithm::bitap<char,std::bitset<32ul>,std::array<std::bitset<32ul>,256ul>>,std::__cxx11::string>>
            (__return_storage_ptr__,(boost *)&local_50,&local_80,
             (bitap_iterator<burst::algorithm::bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)text);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_80.m_bitap.m_bitmask_table.
              super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.m_bitap.m_bitmask_table.
              super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b0.m_bitap.m_bitmask_table.
              super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e0.m_bitap.m_bitmask_table.
              super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

auto bitap (const ForwardRange1 & pattern, const ForwardRange2 & text)
    {
        auto bitap = algorithm::make_bitap<Bitmask>(pattern);
        auto begin = make_bitap_iterator(std::move(bitap), text);
        auto end = make_bitap_iterator(iterator::end_tag, begin);

        return boost::make_iterator_range(std::move(begin), std::move(end));
    }